

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_start_excitation(HTS_Vocoder *v,double pitch)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  double pitch_local;
  HTS_Vocoder *v_local;
  
  if (((v->pitch_of_curr_point == 0.0) && (!NAN(v->pitch_of_curr_point))) ||
     ((pitch == 0.0 && (!NAN(pitch))))) {
    v->pitch_inc_per_point = 0.0;
    v->pitch_of_curr_point = pitch;
    v->pitch_counter = pitch;
  }
  else {
    sVar1 = v->fprd;
    auVar2._8_4_ = (int)(sVar1 >> 0x20);
    auVar2._0_8_ = sVar1;
    auVar2._12_4_ = 0x45300000;
    v->pitch_inc_per_point =
         (pitch - v->pitch_of_curr_point) /
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  }
  return;
}

Assistant:

static void HTS_Vocoder_start_excitation(HTS_Vocoder * v, double pitch)
{
   if (v->pitch_of_curr_point != 0.0 && pitch != 0.0) {
      v->pitch_inc_per_point = (pitch - v->pitch_of_curr_point) / v->fprd;
   } else {
      v->pitch_inc_per_point = 0.0;
      v->pitch_of_curr_point = pitch;
      v->pitch_counter = pitch;
   }
}